

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctemplate.c
# Opt level: O1

void ctemplate_destroy(ctemplate_t *ctemplate)

{
  loader_module_t *module;
  
  module = ctemplate->modules;
  while (module != (loader_module_t *)0x0) {
    module = loader_unloadModule(module);
    ctemplate->modules = module;
  }
  safe_destroy(ctemplate->templateBaseDir);
  safe_destroy(ctemplate->workingBaseDir);
  modules_destroy(ctemplate->translation_modules);
  free(ctemplate);
  return;
}

Assistant:

void ctemplate_destroy(ctemplate_t *ctemplate) {
	while ( ctemplate->modules != NULL ) {
		ctemplate->modules = loader_unloadModule(ctemplate->modules);
	}
	safe_destroy(ctemplate->templateBaseDir);
	safe_destroy(ctemplate->workingBaseDir);
	modules_destroy(ctemplate->translation_modules);
	free(ctemplate);
}